

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arith.hpp
# Opt level: O0

size_t byte_decode(uint8_t *ibuff,size_t isize,uint64_t max,uint64_t *v)

{
  int offset;
  uint64_t newv;
  size_t ip;
  uint64_t *v_local;
  uint64_t max_local;
  size_t isize_local;
  uint8_t *ibuff_local;
  
  ip = 0;
  newv = 0;
  offset = 0;
  for (max_local = max - 1; max_local != 0; max_local = max_local >> 8) {
    newv = ((ulong)ibuff[ip] << ((byte)offset & 0x3f)) + newv;
    offset = offset + 8;
    ip = ip + 1;
  }
  *v = newv + 1;
  return ip;
}

Assistant:

size_t byte_decode(
    const uint8_t* ibuff, size_t isize, uint64_t max, uint64_t* v)
{
    size_t ip = 0;
    uint64_t newv = 0;
    int offset = 0;
    max--; /* working here with zero-origin values */
    while (max) {
        // myassert(ip < isize);
        newv += (((uint64_t)ibuff[ip++]) << offset);
        max >>= 8;
        offset += 8;
    }
    *v = newv + 1;
    return ip;
}